

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::LoadASCIIFromFile
          (TinyGLTF *this,Model *model,string *err,string *warn,string *filename,uint check_sections
          )

{
  string *warn_00;
  string *err_00;
  string *model_00;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference str;
  tinygltf local_288 [7];
  bool ret;
  string basedir;
  size_t sz;
  undefined1 local_239;
  string local_238 [7];
  bool fileread;
  string fileerr;
  undefined1 local_218 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream ss;
  ostream local_1b8 [380];
  uint local_3c;
  string *psStack_38;
  uint check_sections_local;
  string *filename_local;
  string *warn_local;
  string *err_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  local_3c = check_sections;
  psStack_38 = filename;
  filename_local = warn;
  warn_local = err;
  err_local = (string *)model;
  model_local = (Model *)this;
  std::__cxx11::stringstream::stringstream(local_1c8);
  bVar1 = std::operator==(&(this->fs).ReadWholeFile,(nullptr_t)0x0);
  if (bVar1) {
    poVar2 = std::operator<<(local_1b8,"Failed to read file: ");
    poVar2 = std::operator<<(poVar2,(string *)psStack_38);
    poVar2 = std::operator<<(poVar2,": one or more FS callback not set");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (warn_local != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)warn_local,local_1f8);
      std::__cxx11::string::~string(local_1f8);
    }
    this_local._7_1_ = 0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
    std::__cxx11::string::string(local_238);
    local_239 = std::
                function<bool_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void_*)>
                ::operator()(&(this->fs).ReadWholeFile,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_238,psStack_38,(this->fs).user_data);
    if ((bool)local_239) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
      if (sVar3 == 0) {
        if (warn_local != (string *)0x0) {
          std::__cxx11::string::operator=((string *)warn_local,"Empty file.");
        }
        this_local._7_1_ = 0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      else {
        GetBaseDir(local_288,psStack_38);
        model_00 = err_local;
        err_00 = warn_local;
        warn_00 = filename_local;
        str = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,0);
        sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
        this_local._7_1_ =
             LoadASCIIFromString(this,(Model *)model_00,err_00,warn_00,(char *)str,(uint)sVar3,
                                 (string *)local_288,local_3c);
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_288);
      }
    }
    else {
      poVar2 = std::operator<<(local_1b8,"Failed to read file: ");
      poVar2 = std::operator<<(poVar2,(string *)psStack_38);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,local_238);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      if (warn_local != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=((string *)warn_local,(string *)&sz);
        std::__cxx11::string::~string((string *)&sz);
      }
      this_local._7_1_ = 0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    std::__cxx11::string::~string(local_238);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
  }
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TinyGLTF::LoadASCIIFromFile(Model *model, std::string *err,
                                 std::string *warn, const std::string &filename,
                                 unsigned int check_sections) {
  std::stringstream ss;

  if (fs.ReadWholeFile == nullptr) {
    // Programmer error, assert() ?
    ss << "Failed to read file: " << filename
       << ": one or more FS callback not set" << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  std::vector<unsigned char> data;
  std::string fileerr;
  bool fileread = fs.ReadWholeFile(&data, &fileerr, filename, fs.user_data);
  if (!fileread) {
    ss << "Failed to read file: " << filename << ": " << fileerr << std::endl;
    if (err) {
      (*err) = ss.str();
    }
    return false;
  }

  size_t sz = data.size();
  if (sz == 0) {
    if (err) {
      (*err) = "Empty file.";
    }
    return false;
  }

  std::string basedir = GetBaseDir(filename);

  bool ret = LoadASCIIFromString(
      model, err, warn, reinterpret_cast<const char *>(&data.at(0)),
      static_cast<unsigned int>(data.size()), basedir, check_sections);

  return ret;
}